

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void Rml::QuerySelectorAllMatchRecursive
               (ElementList *matching_elements,StyleSheetNodeListRaw *nodes,Element *element,
               Element *scope)

{
  pointer *pppEVar1;
  pointer ppSVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  int iVar5;
  pointer ppSVar6;
  ulong uVar7;
  StyleSheetNodeListRaw *__range2;
  Element *child;
  _Head_base<0UL,_Rml::Element_*,_false> local_48;
  ulong local_40;
  Element *local_38;
  
  iVar5 = (int)((ulong)((long)(element->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(element->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar4 = iVar5 - element->num_non_dom_children;
  if (uVar4 != 0 && element->num_non_dom_children <= iVar5) {
    local_40 = (ulong)uVar4;
    uVar7 = 0;
    local_38 = element;
    do {
      local_48._M_head_impl =
           *(Element **)
            &(local_38->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
             super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t;
      iVar5 = ::std::__cxx11::string::compare((char *)((long)local_48._M_head_impl + 0x38));
      if (iVar5 != 0) {
        ppSVar2 = (nodes->
                  super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppSVar6 = (nodes->
                       super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar2;
            ppSVar6 = ppSVar6 + 1) {
          bVar3 = StyleSheetNode::IsApplicable(*ppSVar6,local_48._M_head_impl,scope);
          if (bVar3) {
            __position._M_current =
                 (matching_elements->
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (matching_elements->
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
              _M_realloc_insert<Rml::Element*const&>
                        ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)matching_elements,
                         __position,&local_48._M_head_impl);
            }
            else {
              *__position._M_current = local_48._M_head_impl;
              pppEVar1 = &(matching_elements->
                          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppEVar1 = *pppEVar1 + 1;
            }
            break;
          }
        }
        QuerySelectorAllMatchRecursive(matching_elements,nodes,local_48._M_head_impl,scope);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_40);
  }
  return;
}

Assistant:

const String& Element::GetId() const
{
	return id;
}